

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.hpp
# Opt level: O2

void __thiscall
Callback::Emitter::emit<MyEmitter,String,int>
          (Emitter *this,offset_in_MyEmitter_to_subr signal,String *arg0,int arg1)

{
  undefined4 in_register_0000000c;
  code *pcVar1;
  undefined4 in_R8D;
  long *plVar2;
  SignalActivation activation;
  SignalActivation local_90;
  MemberFuncPtr local_68;
  String local_58;
  
  MemberFuncPtr::MemberFuncPtr<void(MyEmitter::*)(String,int)>(&local_68,signal);
  SignalActivation::SignalActivation(&local_90,this,&local_68);
  for (; local_90.begin.item != local_90.end.item; local_90.begin.item = (local_90.begin.item)->next
      ) {
    if (((local_90.begin.item)->value).state == connected) {
      pcVar1 = (code *)((local_90.begin.item)->value).slot.ptr;
      plVar2 = (long *)((long)((local_90.begin.item)->value).object +
                       *(long *)&((local_90.begin.item)->value).slot.field_0x8);
      if (((ulong)pcVar1 & 1) != 0) {
        pcVar1 = *(code **)(pcVar1 + *plVar2 + -1);
      }
      String::String(&local_58,(String *)CONCAT44(in_register_0000000c,arg1));
      (*pcVar1)(plVar2,&local_58,in_R8D);
      String::~String(&local_58);
    }
    if (local_90.invalidated != false) break;
  }
  SignalActivation::~SignalActivation(&local_90);
  return;
}

Assistant:

void emit(void (X::*signal)(A, B), A arg0, B arg1){SignalActivation activation(this, signal); for(List<Slot>::Iterator i = activation.begin; i != activation.end; ++i) {if(i->state == Slot::connected) 
      (((X*)i->object)->*((MemberFuncPtr2<X, A, B>*)&i->slot)->ptr)(arg0, arg1); if(activation.invalidated) return;}}